

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::getNextHeaderToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  TokenizerException *pTVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  allocator<char> local_129;
  string local_128;
  _Optional_payload_base<char> local_102;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_100;
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0;
  _Optional_payload_base<char> local_ab;
  byte local_a9;
  int local_a8;
  undefined1 local_a2;
  bool matches;
  int i;
  _Optional_payload_base<char> local_7c;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  _Optional_payload_base<char> local_57;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  _Optional_payload_base<char> local_1d;
  _Optional_payload_base<char> local_1b;
  char local_19;
  optional<char> _;
  Tokenizer *pTStack_18;
  char c;
  Tokenizer *this_local;
  
  pTStack_18 = this;
  std::optional<char>::optional((optional<char> *)&local_1b);
  local_1d = (_Optional_payload_base<char>)next(this);
  local_1b = local_1d;
  bVar2 = std::optional<char>::has_value((optional<char> *)&local_1b);
  if (!bVar2) {
    local_55 = 1;
    pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unexpected EOF while parsing HeaderBlock",&local_41);
    TokenizerException::TokenizerException
              (pTVar4,&local_40,this->line_number,this->col_number,&this->current_line);
    local_55 = 0;
    __cxa_throw(pTVar4,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  pcVar5 = std::optional<char>::value((optional<char> *)&local_1b);
  local_19 = *pcVar5;
  while (iVar3 = isspace((int)local_19), iVar3 != 0) {
    local_57 = (_Optional_payload_base<char>)next(this);
    local_1b = local_57;
    bVar2 = std::optional<char>::has_value((optional<char> *)&local_1b);
    if (!bVar2) {
      local_7a = 1;
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Unexpected EOF while parsing HeaderBlock",&local_79);
      TokenizerException::TokenizerException
                (pTVar4,&local_78,this->line_number,this->col_number,&this->current_line);
      local_7a = 0;
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar5 = std::optional<char>::value((optional<char> *)&local_1b);
    local_19 = *pcVar5;
  }
  if (local_19 == ']') {
    local_7c = (_Optional_payload_base<char>)peek(this);
    local_1b = local_7c;
    bVar2 = std::optional<char>::has_value((optional<char> *)&local_1b);
    if (!bVar2) {
      local_a2 = 1;
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"Unexpected EOF while parsing HeaderBlock",(allocator<char> *)&matches
                );
      TokenizerException::TokenizerException
                (pTVar4,(string *)&i,this->line_number,this->col_number,&this->current_line);
      local_a2 = 0;
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar5 = std::optional<char>::value((optional<char> *)&local_1b);
    if (*pcVar5 == ']') {
      local_a9 = 1;
      for (local_a8 = 0; uVar6 = (ulong)local_a8, uVar7 = std::__cxx11::string::length(),
          uVar6 < uVar7; local_a8 = local_a8 + 1) {
        local_ab = (_Optional_payload_base<char>)peek(this,local_a8 + 1);
        local_1b = local_ab;
        bVar2 = std::optional<char>::has_value((optional<char> *)&local_1b);
        if (!bVar2) {
          local_d2 = 1;
          pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"Unexpected EOF while parsing HeaderBlock",&local_d1);
          TokenizerException::TokenizerException
                    (pTVar4,&local_d0,this->line_number,this->col_number,&this->current_line);
          local_d2 = 0;
          __cxa_throw(pTVar4,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
        }
        pcVar5 = std::optional<char>::value((optional<char> *)&local_1b);
        cVar1 = *pcVar5;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->header_block_name);
        if (cVar1 != *pcVar5) {
          local_a9 = 0;
          break;
        }
      }
      if ((local_a9 & 1) != 0) {
        next(this,local_a8 + 1);
        this->parsingHeaderBlock = false;
        std::variant<int,double,std::__cxx11::string,bool,char>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,double,std::__cxx11::string,bool,char> *)&local_100,
                   &this->header_block_name);
        Token::Token(__return_storage_ptr__,HeaderCloser,(tokenValue *)&local_100);
        std::
        variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::~variant(&local_100);
        return __return_storage_ptr__;
      }
    }
  }
  if (local_19 == ':') {
    local_102 = (_Optional_payload_base<char>)peek(this);
    local_1b = local_102;
    bVar2 = std::optional<char>::has_value((optional<char> *)&local_1b);
    if (!bVar2) {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"Unexpected EOF while parsing HeaderBlock",&local_129);
      TokenizerException::TokenizerException
                (pTVar4,&local_128,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
    }
    pcVar5 = std::optional<char>::value((optional<char> *)&local_1b);
    if (*pcVar5 != ':') {
      Token::Token(__return_storage_ptr__,Colon);
      return __return_storage_ptr__;
    }
    next(this);
  }
  if ((this->currentToken).type == Colon) {
    parseHeaderValue(__return_storage_ptr__,this,local_19);
  }
  else {
    parseHeaderKey(__return_storage_ptr__,this,local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextHeaderToken() {
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
    }
    c = _.value();

    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        }
        c = _.value();
    }

    if (c == ']') {
        _ = peek();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        } else if (_.value() == ']') {
            int i;
            bool matches = true;
            for (i = 0; i < header_block_name.length(); i++) {
                _ = peek(1 + i);
                if (!_.has_value()) {
                    throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number,
                                             current_line);
                }
                if (_.value() != header_block_name[i]) {
                    matches = false;
                    break;
                }
            }
            if (matches) {
                next(1 + i);
                parsingHeaderBlock = false;
                return Token(HeaderCloser, header_block_name);
            }
        }
    }
    if (c == ':') {
        _ = peek();
        if (!_.has_value())
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        if (_.value() != ':') {
            return Token(Colon);
        } else {
            next();
        }
    }
    if (currentToken.type == Colon) {
        return parseHeaderValue(c);
    } else {
        return parseHeaderKey(c);
    }
}